

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.cc
# Opt level: O2

bool __thiscall
draco::AttributesEncoder::EncodeAttributesEncoderData
          (AttributesEncoder *this,EncoderBuffer *out_buffer)

{
  pointer piVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var2;
  undefined8 in_RAX;
  uint32_t i;
  ulong uVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  EncodeVarint<unsigned_int>
            ((uint)((ulong)((long)(this->point_attribute_ids_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->point_attribute_ids_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2),out_buffer);
  for (uVar3 = 0;
      piVar1 = (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < ((ulong)((long)(this->point_attribute_ids_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar1) >> 2 & 0xffffffff);
      uVar3 = uVar3 + 1) {
    _Var2._M_t.
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
    super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
         (this->point_cloud_->attributes_).
         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[piVar1[uVar3]]._M_t.
         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
         _M_t;
    uStack_38 = CONCAT17(*(undefined1 *)
                          ((long)_Var2._M_t.
                                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                          + 0x38),(undefined7)uStack_38);
    EncoderBuffer::Encode<unsigned_char>(out_buffer,(uchar *)((long)&uStack_38 + 7));
    uStack_38._0_7_ =
         CONCAT16(*(undefined1 *)
                   ((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x1c
                   ),(undefined6)uStack_38);
    EncoderBuffer::Encode<unsigned_char>(out_buffer,(uchar *)((long)&uStack_38 + 6));
    uStack_38._0_6_ =
         CONCAT15(*(undefined1 *)
                   ((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x18
                   ),(undefined5)uStack_38);
    EncoderBuffer::Encode<unsigned_char>(out_buffer,(uchar *)((long)&uStack_38 + 5));
    uStack_38._0_5_ =
         CONCAT14(*(undefined1 *)
                   ((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x20
                   ),(undefined4)uStack_38);
    EncoderBuffer::Encode<unsigned_char>(out_buffer,(uchar *)((long)&uStack_38 + 4));
    EncodeVarint<unsigned_int>
              (*(uint *)((long)_Var2._M_t.
                               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                        0x3c),out_buffer);
  }
  return true;
}

Assistant:

bool AttributesEncoder::EncodeAttributesEncoderData(EncoderBuffer *out_buffer) {
  // Encode data about all attributes.
  EncodeVarint(num_attributes(), out_buffer);
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int32_t att_id = point_attribute_ids_[i];
    const PointAttribute *const pa = point_cloud_->attribute(att_id);
    GeometryAttribute::Type type = pa->attribute_type();
#ifdef DRACO_TRANSCODER_SUPPORTED
    // Attribute types TANGENT, MATERIAL, JOINTS, and WEIGHTS are not supported
    // in the official bitstream. They will be encoded as GENERIC.
    if (type > GeometryAttribute::GENERIC) {
      type = GeometryAttribute::GENERIC;
    }
#endif
    out_buffer->Encode(static_cast<uint8_t>(type));
    out_buffer->Encode(static_cast<uint8_t>(pa->data_type()));
    out_buffer->Encode(static_cast<uint8_t>(pa->num_components()));
    out_buffer->Encode(static_cast<uint8_t>(pa->normalized()));
    EncodeVarint(pa->unique_id(), out_buffer);
  }
  return true;
}